

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

RuleInfo * __thiscall
anon_unknown.dwarf_2a7c26::BuildEngineImpl::addRule
          (BuildEngineImpl *this,KeyID keyID,
          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *rule)

{
  __node_base *p_Var1;
  size_type *psVar2;
  Rule *pRVar3;
  __node_ptr __bkt;
  BuildEngineDelegate *pBVar4;
  _Hash_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  BuildDB *pBVar7;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
  *this_00;
  __node_ptr p_Var8;
  long *plVar9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  size_type *psVar11;
  key_type *__key;
  size_type __n;
  ulong uVar12;
  __node_ptr __n_00;
  _Hash_node_base _Var13;
  ulong uVar14;
  RuleInfo *pRVar15;
  undefined1 auVar16 [16];
  __buckets_alloc_type __alloc;
  string local_88;
  Child local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Twine local_48;
  
  pRVar3 = (rule->_M_t).
           super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
           _M_t.
           super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
           super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
  (rule->_M_t).super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
  ._M_t.super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
  super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl = (Rule *)0x0;
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
             *)operator_new(0xa8);
  *(undefined8 *)&this_00->field_0x0 = 0;
  *(ValueTy *)(this_00 + 8) = keyID._value;
  *(ValueTy *)(this_00 + 0x10) = keyID._value;
  *(Rule **)(this_00 + 0x18) = pRVar3;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(undefined8 *)(this_00 + 0x28) = 0;
  *(undefined8 *)(this_00 + 0x30) = 0;
  *(undefined8 *)(this_00 + 0x38) = 0;
  *(undefined8 *)(this_00 + 0x40) = 0;
  *(undefined8 *)(this_00 + 0x48) = 0;
  *(undefined8 *)(this_00 + 0x50) = 0;
  *(undefined8 *)(this_00 + 0x58) = 0;
  *(undefined8 *)(this_00 + 0x60) = 0;
  *(undefined8 *)(this_00 + 0x68) = 0;
  *(undefined8 *)(this_00 + 0x70) = 0;
  *(undefined8 *)(this_00 + 0x78) = 0;
  *(undefined8 *)(this_00 + 0x80) = 0;
  *(undefined8 *)(this_00 + 0x88) = 0;
  *(undefined8 *)(this_00 + 0x8d) = 0;
  *(undefined8 *)(this_00 + 0x95) = 0;
  __bkt = (__node_ptr)(this->ruleInfos)._M_h._M_bucket_count;
  __key = (key_type *)(keyID._value % (ulong)__bkt);
  __n_00 = __bkt;
  p_Var8 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(this->ruleInfos)._M_h._M_buckets,(size_type)__bkt,__key,keyID._value);
  if (p_Var8 == (__node_ptr)0x0) {
    auVar16 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->ruleInfos)._M_h._M_rehash_policy,(ulong)__bkt,
                         (this->ruleInfos)._M_h._M_element_count);
    __n = auVar16._8_8_;
    if ((auVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this->ruleInfos)._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->ruleInfos)._M_h._M_single_bucket;
        (this->ruleInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_88,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var13._M_nxt = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->ruleInfos)._M_h._M_before_begin;
        uVar14 = 0;
        do {
          p_Var5 = (_Var13._M_nxt)->_M_nxt;
          uVar12 = (ulong)_Var13._M_nxt[0x14]._M_nxt % __n;
          if (__s[uVar12] == (_Hash_node_base *)0x0) {
            (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var13._M_nxt;
            __s[uVar12] = p_Var1;
            if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar14;
              goto LAB_00160d7f;
            }
          }
          else {
            (_Var13._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
            pp_Var10 = &__s[uVar12]->_M_nxt;
            uVar12 = uVar14;
LAB_00160d7f:
            *pp_Var10 = _Var13._M_nxt;
          }
          _Var13._M_nxt = p_Var5;
          uVar14 = uVar12;
        } while (p_Var5 != (_Hash_node_base *)0x0);
      }
      pp_Var6 = (this->ruleInfos)._M_h._M_buckets;
      if (&(this->ruleInfos)._M_h._M_single_bucket != pp_Var6) {
        operator_delete(pp_Var6,(this->ruleInfos)._M_h._M_bucket_count << 3);
      }
      (this->ruleInfos)._M_h._M_bucket_count = __n;
      (this->ruleInfos)._M_h._M_buckets = __s;
      __key = (key_type *)(keyID._value % __n);
    }
    *(ValueTy *)(this_00 + 0xa0) = keyID._value;
    if (__s[(long)__key] == (_Hash_node_base *)0x0) {
      p_Var5 = (this->ruleInfos)._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)&this_00->field_0x0 = p_Var5;
      (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_00;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var5[0x14]._M_nxt % (this->ruleInfos)._M_h._M_bucket_count] =
             (__node_base_ptr)this_00;
        __s = (this->ruleInfos)._M_h._M_buckets;
      }
      __s[(long)__key] = &(this->ruleInfos)._M_h._M_before_begin;
    }
    else {
      *(_Hash_node_base **)&this_00->field_0x0 = __s[(long)__key]->_M_nxt;
      __s[(long)__key]->_M_nxt = (_Hash_node_base *)this_00;
    }
    psVar2 = &(this->ruleInfos)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    pRVar15 = (RuleInfo *)(this_00 + 0x10);
    pBVar7 = (this->db)._M_t.
             super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
             .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
    if (pBVar7 != (BuildDB *)0x0) {
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity =
           local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      (*pBVar7->_vptr_BuildDB[5])
                (pBVar7,*(undefined8 *)(this_00 + 0x10),*(long *)(this_00 + 0x18) + 8,this_00 + 0x28
                 ,&local_88);
      if (local_88._M_string_length != 0) {
        pBVar4 = this->delegate;
        llvm::Twine::Twine((Twine *)local_68,&local_88);
        (*pBVar4->_vptr_BuildEngineDelegate[7])(pBVar4,local_68);
        LOCK();
        (this->buildCancelled)._M_base._M_i = true;
        UNLOCK();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
    ::_M_deallocate_node(this_00,__n_00);
    pBVar4 = this->delegate;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "attempt to register duplicate rule \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)((long)&(p_Var8->
                                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                                     ._M_storage._M_storage + 0x10) + 8));
    plVar9 = (long *)std::__cxx11::string::append(&local_68[0].character);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_88.field_2._M_allocated_capacity = *psVar11;
      local_88.field_2._8_8_ = plVar9[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar11;
      local_88._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_88._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    llvm::Twine::Twine(&local_48,&local_88);
    (*pBVar4->_vptr_BuildEngineDelegate[7])(pBVar4,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68[0].twine != &local_58) {
      operator_delete(local_68[0].twine,local_58._M_allocated_capacity + 1);
    }
    pRVar15 = (RuleInfo *)
              ((long)&(p_Var8->
                      super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                      ._M_storage._M_storage + 8);
    LOCK();
    (this->buildCancelled)._M_base._M_i = true;
    UNLOCK();
  }
  return pRVar15;
}

Assistant:

RuleInfo& addRule(KeyID keyID, std::unique_ptr<Rule>&& rule) {
    auto result = ruleInfos.emplace(keyID, RuleInfo(keyID, std::move(rule)));
    if (!result.second) {
      RuleInfo& ruleInfo = result.first->second;
      delegate.error("attempt to register duplicate rule \"" + ruleInfo.rule->key.str() + "\"\n");

      // Set cancelled, but return something 'valid' for use until it is
      // processed.
      buildCancelled = true;
      return ruleInfo;
    }

    // If we have a database attached, retrieve any stored result.
    //
    // FIXME: Investigate retrieving this result lazily. If the DB is
    // particularly efficient, it may be best to retrieve this only when we need
    // it and never duplicate it.
    RuleInfo& ruleInfo = result.first->second;
    if (db) {
      std::string error;
      db->lookupRuleResult(ruleInfo.keyID, *ruleInfo.rule, &ruleInfo.result, &error);
      if (!error.empty()) {
        // FIXME: Investigate changing the database error handling model to
        // allow builds to proceed without the database.
        delegate.error(error);
        buildCancelled = true;
      }
    }

    return ruleInfo;
  }